

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int makesky(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Allocator alloc;
  Point2i resolution_00;
  char *msg;
  long *plVar7;
  long lVar8;
  float fVar9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Float elevation;
  int resolution;
  Float turbidity;
  Float albedo;
  vector<float,_std::allocator<float>_> lambda;
  RGBColorSpace *colorSpace;
  Vector3f sunDir;
  string outfile;
  ArHosekSkyModelState *skymodel_state;
  ImageMetadata metadata;
  Image img;
  float local_428;
  int local_424;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_420;
  char **local_418;
  float local_410;
  float local_40c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  string local_3f8;
  undefined8 *local_3d8;
  long lStack_3d0;
  long local_3c8;
  string local_3c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_3a0;
  string local_398;
  undefined4 local_374;
  undefined4 local_370;
  float local_36c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  code *local_2d0;
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  ArHosekSkyModelState *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *pcStack_268;
  code *pcStack_260;
  SpectrumHandle local_258;
  ColorEncodingHandle local_250;
  undefined1 local_248 [48];
  undefined1 local_218 [16];
  string local_208 [8];
  bool local_200;
  long local_1f8 [7];
  bool local_1bc;
  bool local_1a8;
  bool local_19c;
  bool local_194;
  bool local_18c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_188;
  bool local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  undefined1 local_148 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_40c = 0.5;
  local_410 = 3.0;
  local_428 = 10.0;
  local_424 = 0x800;
  local_420 = &local_3f8.field_2;
  local_408 = &local_3c0.field_2;
  local_400 = &local_398.field_2;
  local_418 = argv;
  do {
    if (*local_418 == (char *)0x0) {
      if (local_368._M_string_length == 0) {
        msg = "--outfile must be specified";
      }
      else {
        msg = "--albedo must be between 0 and 1";
        if ((((0.0 <= local_40c) && (local_40c <= 1.0)) &&
            (msg = "--turbidity must be between 1.7 and 10.", local_410 <= 10.0)) &&
           (((1.7 <= local_410 && (msg = "--elevation must be between 0. and 90.", 0.0 <= local_428)
             ) && (local_428 <= 90.0)))) {
          local_428 = local_428 * 0.017453292;
          if (0 < local_424) {
            fVar9 = cosf(local_428);
            local_420 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_420._4_4_,fVar9);
            local_36c = sinf(local_428);
            iVar3 = local_424;
            local_374 = 0;
            local_370 = local_420._0_4_;
            local_248._0_8_ = (long)local_248 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"R","");
            local_248._32_8_ = local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_248 + 0x20),"G","");
            plVar7 = local_1f8;
            local_208 = (string  [8])plVar7;
            std::__cxx11::string::_M_construct<char_const*>(local_208,"B","");
            local_250.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            alloc.memoryResource = pstd::pmr::new_delete_resource();
            resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar3;
            resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar3;
            channels.n = 3;
            channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_248;
            pbrt::Image::Image((Image *)local_148,Float,resolution_00,channels,&local_250,alloc);
            lVar8 = -0x60;
            do {
              if (plVar7 != (long *)plVar7[-2]) {
                operator_delete((long *)plVar7[-2],*plVar7 + 1);
              }
              plVar7 = plVar7 + -4;
              lVar8 = lVar8 + 0x20;
            } while (lVar8 != 0);
            local_3d8 = (undefined8 *)0x0;
            lStack_3d0 = 0;
            local_3c8 = 0;
            local_3d8 = (undefined8 *)operator_new(0x34);
            lStack_3d0 = (long)local_3d8 + 0x34;
            *(undefined8 *)((long)local_3d8 + 0x14) = 0;
            *(undefined8 *)((long)local_3d8 + 0x1c) = 0;
            *(undefined8 *)((long)local_3d8 + 0x24) = 0;
            *(undefined8 *)((long)local_3d8 + 0x2c) = 0;
            *local_3d8 = 0;
            local_3d8[1] = 0;
            local_3d8[2] = 0;
            local_3d8[3] = 0;
            *(undefined4 *)local_3d8 = 0x43a00000;
            *(undefined4 *)((long)local_3d8 + 4) = 0x43b0aaab;
            *(undefined4 *)(local_3d8 + 1) = 0x43c15555;
            *(undefined4 *)((long)local_3d8 + 0xc) = 0x43d20000;
            *(undefined4 *)(local_3d8 + 2) = 0x43e2aaaa;
            *(undefined4 *)((long)local_3d8 + 0x14) = 0x43f35556;
            *(undefined4 *)(local_3d8 + 3) = 0x44020000;
            *(undefined4 *)((long)local_3d8 + 0x1c) = 0x440a5555;
            *(undefined4 *)(local_3d8 + 4) = 0x4412aaab;
            *(undefined4 *)((long)local_3d8 + 0x24) = 0x441b0000;
            *(undefined4 *)(local_3d8 + 5) = 0x44235555;
            *(undefined4 *)((long)local_3d8 + 0x2c) = 0x442baaab;
            *(undefined4 *)(local_3d8 + 6) = 0x44340000;
            *(undefined4 *)((long)local_3d8 + 0x34) = *(undefined4 *)((long)local_3d8 + 0x34);
            *(undefined4 *)(local_3d8 + 7) = *(undefined4 *)(local_3d8 + 7);
            *(undefined4 *)((long)local_3d8 + 0x3c) = *(undefined4 *)((long)local_3d8 + 0x3c);
            local_3c8 = lStack_3d0;
            local_2a0 = arhosekskymodelstate_alloc_init
                                  ((double)local_428,(double)local_410,(double)local_40c);
            local_3a0 = pbrt::RGBColorSpace::ACES2065_1;
            local_258.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                     )((long)pbrt::RGBColorSpace::ACES2065_1 + 0x20U | 0x2000000000000);
            pbrt::SpectrumToXYZ(&local_258);
            lVar8 = (long)local_424;
            local_278._M_unused._M_object = (void *)0x0;
            local_278._8_8_ = 0;
            pcStack_268 = (code *)0x0;
            pcStack_260 = (code *)0x0;
            local_278._M_unused._M_object = operator_new(0x30);
            *(undefined8 ***)local_278._M_unused._0_8_ = &local_3d8;
            *(int **)((long)local_278._M_unused._0_8_ + 8) = &local_424;
            *(undefined4 **)((long)local_278._M_unused._0_8_ + 0x10) = &local_374;
            *(ArHosekSkyModelState ***)((long)local_278._M_unused._0_8_ + 0x18) = &local_2a0;
            *(aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              **)((long)local_278._M_unused._0_8_ + 0x20) = &local_3a0;
            *(Image **)((long)local_278._M_unused._0_8_ + 0x28) = (Image *)local_148;
            pcStack_260 = std::
                          _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                          ::_M_invoke;
            pcStack_268 = std::
                          _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                          ::_M_manager;
            pbrt::ParallelFor(0,lVar8,(function<void_(long,_long)> *)&local_278);
            if (pcStack_268 != (code *)0x0) {
              (*pcStack_268)(&local_278,&local_278,__destroy_functor);
            }
            local_178._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_178._M_impl.super__Rb_tree_header._M_header;
            local_248[4] = 0;
            local_200 = false;
            local_1bc = false;
            local_1a8 = false;
            local_19c = false;
            local_194 = false;
            local_18c = false;
            local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_188 = local_3a0;
            local_180 = true;
            local_178._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_left;
            bVar4 = pbrt::Image::Write((Image *)local_148,&local_368,(ImageMetadata *)local_248);
            if (!bVar4) {
              pbrt::LogFatal<char_const(&)[29]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                         ,0x13a,"Check failed: %s",(char (*) [29])"img.Write(outfile, metadata)");
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_178);
            if (local_180 == true) {
              local_180 = false;
            }
            if (local_18c == true) {
              local_18c = false;
            }
            if (local_194 == true) {
              local_194 = false;
            }
            if (local_19c == true) {
              local_19c = false;
            }
            if (local_1a8 == true) {
              local_1a8 = false;
            }
            if (local_1bc == true) {
              local_1bc = false;
            }
            if (local_200 == true) {
              local_200 = false;
            }
            if ((bool)local_248[4] == true) {
              local_248[4] = 0;
            }
            if (local_3d8 != (undefined8 *)0x0) {
              operator_delete(local_3d8,local_3c8 - (long)local_3d8);
            }
            local_38 = 0;
            (*(local_50.memoryResource)->_vptr_memory_resource[3])
                      (local_50.memoryResource,local_48,local_40 << 2,4);
            local_58 = 0;
            (*(local_70.memoryResource)->_vptr_memory_resource[3])
                      (local_70.memoryResource,local_68,local_60 * 2,2);
            local_78 = 0;
            (*(local_90.memoryResource)->_vptr_memory_resource[3])
                      (local_90.memoryResource,local_88,local_80,1);
            pbrt::
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector(&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,
                              CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                       local_368.field_2._M_local_buf[0]) + 1);
            }
            return 0;
          }
          msg = "--resolution must be >= 1";
        }
      }
      usage("makesky",msg);
    }
    local_148._0_8_ = &local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"outfile","");
    local_298._M_unused._M_object = (void *)0x0;
    local_298._8_8_ = 0;
    local_280 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_invoke;
    local_288 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_manager;
    bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                      (&local_418,(string *)local_148,&local_368,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_298);
    bVar6 = true;
    if (bVar4) {
LAB_001ed221:
      bVar2 = false;
      bVar1 = false;
      bVar5 = false;
    }
    else {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"albedo","");
      local_2c8._M_unused._M_object = (void *)0x0;
      local_2c8._8_8_ = 0;
      local_2b0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_invoke;
      local_2b8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_manager;
      bVar5 = pbrt::ParseArg<float*>
                        (&local_418,&local_3f8,&local_40c,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2c8);
      if (bVar5) goto LAB_001ed221;
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"turbidity","");
      local_2e8._M_unused._M_object = (void *)0x0;
      local_2e8._8_8_ = 0;
      local_2d0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_invoke;
      local_2d8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_manager;
      bVar6 = pbrt::ParseArg<float*>
                        (&local_418,&local_3c0,&local_410,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2e8);
      if (bVar6) {
        bVar1 = false;
LAB_001ed48a:
        bVar5 = false;
        bVar2 = true;
        bVar6 = true;
      }
      else {
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"elevation","");
        local_308._M_unused._M_object = (void *)0x0;
        local_308._8_8_ = 0;
        local_2f0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_invoke;
        local_2f8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_manager;
        bVar6 = pbrt::ParseArg<float*>
                          (&local_418,&local_398,&local_428,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_308);
        if (bVar6) {
          bVar1 = true;
          goto LAB_001ed48a;
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"resolution","");
        local_328._M_unused._M_object = (void *)0x0;
        local_328._8_8_ = 0;
        local_310 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_invoke;
        local_318 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_manager;
        bVar6 = pbrt::ParseArg<int*>
                          (&local_418,&local_348,&local_424,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_328);
        bVar2 = true;
        bVar1 = true;
        bVar5 = true;
      }
    }
    if (bVar5) {
      if (local_318 != (code *)0x0) {
        (*local_318)(&local_328,&local_328,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar1) {
      if (local_2f8 != (code *)0x0) {
        (*local_2f8)(&local_308,&local_308,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar2) {
      if (local_2d8 != (code *)0x0) {
        (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar4) {
      if (local_2b8 != (code *)0x0) {
        (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_288 != (code *)0x0) {
      (*local_288)(&local_298,&local_298,__destroy_functor);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_148._0_8_ != &local_138) {
      operator_delete((void *)local_148._0_8_,
                      CONCAT71(local_138.alloc.memoryResource._1_7_,
                               local_138.alloc.memoryResource._0_1_) + 1);
    }
    if (bVar6 == false) {
      local_148._8_8_ = 0;
      local_138.alloc.memoryResource._0_1_ = '\0';
      local_148._0_8_ = &local_138;
      pbrt::detail::stringPrintfRecursive<char*&>
                ((string *)local_148,"argument %s invalid",local_418);
      usage("makesky","%s",local_148._0_8_);
    }
  } while( true );
}

Assistant:

int makesky(int argc, char *argv[]) {
    std::string outfile;
    Float albedo = 0.5;
    Float turbidity = 3.;
    Float elevation = 10;
    int resolution = 2048;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("makesky", "%s", err.c_str());
            exit(1);
        };
        if (ParseArg(&argv, "outfile", &outfile, onError) ||
            ParseArg(&argv, "albedo", &albedo, onError) ||
            ParseArg(&argv, "turbidity", &turbidity, onError) ||
            ParseArg(&argv, "elevation", &elevation, onError) ||
            ParseArg(&argv, "resolution", &resolution, onError)) {
            // success
        } else
            onError(StringPrintf("argument %s invalid", *argv));
    }

    if (outfile.empty())
        usage("makesky", "--outfile must be specified");
    if (albedo < 0. || albedo > 1.)
        usage("makesky", "--albedo must be between 0 and 1");
    if (turbidity < 1.7 || turbidity > 10.)
        usage("makesky", "--turbidity must be between 1.7 and 10.");
    if (elevation < 0. || elevation > 90.)
        usage("makesky", "--elevation must be between 0. and 90.");
    elevation = Radians(elevation);
    if (resolution < 1)
        usage("makesky", "--resolution must be >= 1");

    // Vector pointing at the sun. Note that elevation is measured from the
    // horizon--not the zenith, as it is elsewhere in pbrt.
    Vector3f sunDir(0., std::cos(elevation), std::sin(elevation));

    Image img(PixelFormat::Float, {resolution, resolution}, {"R", "G", "B"});

    // They assert wavelengths are in this range...
    int nLambda = 1 + (720 - 320) / 32;
    std::vector<Float> lambda(nLambda, Float(0));
    for (int i = 0; i < nLambda; ++i)
        lambda[i] = Lerp(i / Float(nLambda - 1), 320, 720);

    // Assume a uniform spectral albedo
    ArHosekSkyModelState *skymodel_state =
        arhosekskymodelstate_alloc_init(elevation, turbidity, albedo);

    const RGBColorSpace *colorSpace = RGBColorSpace::ACES2065_1;
    XYZ illumXYZ = SpectrumToXYZ(&colorSpace->illuminant);

    ParallelFor(0, resolution, [&](int64_t start, int64_t end) {
        std::vector<Float> skyv(lambda.size());
        for (int64_t iy = start; iy < end; ++iy) {
            Float y = (iy + 0.5f) / resolution;
            for (int ix = 0; ix < resolution; ++ix) {
                Float x = (ix + 0.5f) / resolution;
                Vector3f v = EqualAreaSquareToSphere({x, y});
                if (v.z <= 0)
                    // downward hemisphere
                    continue;

                Float theta = SphericalTheta(v);

                // Compute the angle between the pixel's direction and the sun
                // direction.
                Float gamma = SafeACos(Dot(v, sunDir));
                DCHECK(gamma >= 0 && gamma <= Pi);

                for (int i = 0; i < lambda.size(); ++i)
                    skyv[i] = arhosekskymodel_solar_radiance(skymodel_state, theta, gamma,
                                                             lambda[i]);

                PiecewiseLinearSpectrum spec(pstd::MakeConstSpan(lambda),
                                             pstd::MakeConstSpan(skyv));
                XYZ xyz = SpectrumToXYZ(&spec);
                RGB rgb = colorSpace->ToRGB(xyz);

                for (int c = 0; c < 3; ++c)
                    img.SetChannel({ix, int(iy)}, c, rgb[c]);
            }
        }
    });

    ImageMetadata metadata;
    metadata.colorSpace = colorSpace;
    CHECK(img.Write(outfile, metadata));

    return 0;
}